

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

void png_write_hIST(png_structrp png_ptr,png_const_uint_16p hist,int num_hist)

{
  png_byte local_23 [3];
  int local_20;
  int iStack_1c;
  png_byte buf [3];
  int i;
  int num_hist_local;
  png_const_uint_16p hist_local;
  png_structrp png_ptr_local;
  
  iStack_1c = num_hist;
  if ((int)(uint)png_ptr->num_palette < num_hist) {
    png_warning(png_ptr,"Invalid number of histogram entries specified");
  }
  else {
    png_write_chunk_header(png_ptr,0x68495354,num_hist << 1);
    for (local_20 = 0; local_20 < iStack_1c; local_20 = local_20 + 1) {
      png_save_uint_16(local_23,(uint)hist[local_20]);
      png_write_chunk_data(png_ptr,local_23,2);
    }
    png_write_chunk_end(png_ptr);
  }
  return;
}

Assistant:

void /* PRIVATE */
png_write_hIST(png_structrp png_ptr, png_const_uint_16p hist, int num_hist)
{
   int i;
   png_byte buf[3];

   png_debug(1, "in png_write_hIST");

   if (num_hist > (int)png_ptr->num_palette)
   {
      png_debug2(3, "num_hist = %d, num_palette = %d", num_hist,
          png_ptr->num_palette);

      png_warning(png_ptr, "Invalid number of histogram entries specified");
      return;
   }

   png_write_chunk_header(png_ptr, png_hIST, (png_uint_32)(num_hist * 2));

   for (i = 0; i < num_hist; i++)
   {
      png_save_uint_16(buf, hist[i]);
      png_write_chunk_data(png_ptr, buf, 2);
   }

   png_write_chunk_end(png_ptr);
}